

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall ValueTest::checkIs(ValueTest *this,Value *value,IsCheck *check)

{
  bool bVar1;
  TestResult *pTVar2;
  bool bVar3;
  
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isObject_;
  bVar3 = Json::Value::isObject(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x50b,"check.isObject_ == value.isObject()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isArray_;
  bVar3 = Json::Value::isArray(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x50c,"check.isArray_ == value.isArray()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isBool_;
  bVar3 = Json::Value::isBool(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x50d,"check.isBool_ == value.isBool()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isDouble_;
  bVar3 = Json::Value::isDouble(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x50e,"check.isDouble_ == value.isDouble()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isInt_;
  bVar3 = Json::Value::isInt(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x50f,"check.isInt_ == value.isInt()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isUInt_;
  bVar3 = Json::Value::isUInt(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x510,"check.isUInt_ == value.isUInt()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isIntegral_;
  bVar3 = Json::Value::isIntegral(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x511,"check.isIntegral_ == value.isIntegral()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isNumeric_;
  bVar3 = Json::Value::isNumeric(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x512,"check.isNumeric_ == value.isNumeric()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isString_;
  bVar3 = Json::Value::isString(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x513,"check.isString_ == value.isString()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isNull_;
  bVar3 = Json::Value::isNull(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x514,"check.isNull_ == value.isNull()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isInt64_;
  bVar3 = Json::Value::isInt64(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x517,"check.isInt64_ == value.isInt64()");
  pTVar2 = (this->super_TestCase).result_;
  bVar1 = check->isUInt64_;
  bVar3 = Json::Value::isUInt64(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar2,bVar1,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x518,"check.isUInt64_ == value.isUInt64()");
  return;
}

Assistant:

void ValueTest::checkIs(const Json::Value& value, const IsCheck& check) {
  JSONTEST_ASSERT_EQUAL(check.isObject_, value.isObject());
  JSONTEST_ASSERT_EQUAL(check.isArray_, value.isArray());
  JSONTEST_ASSERT_EQUAL(check.isBool_, value.isBool());
  JSONTEST_ASSERT_EQUAL(check.isDouble_, value.isDouble());
  JSONTEST_ASSERT_EQUAL(check.isInt_, value.isInt());
  JSONTEST_ASSERT_EQUAL(check.isUInt_, value.isUInt());
  JSONTEST_ASSERT_EQUAL(check.isIntegral_, value.isIntegral());
  JSONTEST_ASSERT_EQUAL(check.isNumeric_, value.isNumeric());
  JSONTEST_ASSERT_EQUAL(check.isString_, value.isString());
  JSONTEST_ASSERT_EQUAL(check.isNull_, value.isNull());

#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL(check.isInt64_, value.isInt64());
  JSONTEST_ASSERT_EQUAL(check.isUInt64_, value.isUInt64());
#else
  JSONTEST_ASSERT_EQUAL(false, value.isInt64());
  JSONTEST_ASSERT_EQUAL(false, value.isUInt64());
#endif
}